

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void __thiscall AReceiver::Handler(AReceiver *this,Event *ev)

{
  Type TVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *msg;
  
  TVar1 = Event::GetType(&in_RSI->super_Event);
  if (TVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[A] START: ");
    pbVar2 = UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetObject(in_RSI);
    poVar3 = std::operator<<(poVar3,(string *)pbVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (TVar1 == 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[A] END");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Handler(Event *ev) {
            switch(ev->GetType()) {
                case Actions::A_STARTED: {
                    UserEvent<std::string> *msg = static_cast<UserEvent<std::string> *>(ev);
                    std::cout << "[A] START: " << msg->GetObject() << std::endl;
                } break;

                case Actions::A_ENDED: {
                    std::cout << "[A] END" << std::endl;
                } break;
            }
        }